

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

void __thiscall cmCPackIFWGenerator::cmCPackIFWGenerator(cmCPackIFWGenerator *this)

{
  _Rb_tree_header *p_Var1;
  
  cmCPackGenerator::cmCPackGenerator(&this->super_cmCPackGenerator);
  (this->super_cmCPackGenerator).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCPackIFWGenerator_0060c6b0;
  cmCPackIFWInstaller::cmCPackIFWInstaller(&this->Installer);
  p_Var1 = &(this->Packages)._M_t._M_impl.super__Rb_tree_header;
  (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header;
  (this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->BinaryPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header;
  (this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DownloadedPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DependentPackages)._M_t._M_impl.super__Rb_tree_header;
  (this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DependentPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header;
  (this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->GroupPackages)._M_t._M_impl.super__Rb_tree_header;
  (this->GroupPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GroupPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GroupPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->GroupPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->GroupPackages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RepoGen)._M_dataplus._M_p = (pointer)&(this->RepoGen).field_2;
  (this->RepoGen)._M_string_length = 0;
  (this->RepoGen).field_2._M_local_buf[0] = '\0';
  (this->BinCreator)._M_dataplus._M_p = (pointer)&(this->BinCreator).field_2;
  (this->BinCreator)._M_string_length = 0;
  (this->BinCreator).field_2._M_local_buf[0] = '\0';
  (this->FrameworkVersion)._M_dataplus._M_p = (pointer)&(this->FrameworkVersion).field_2;
  (this->FrameworkVersion)._M_string_length = 0;
  (this->FrameworkVersion).field_2._M_local_buf[0] = '\0';
  (this->ExecutableSuffix)._M_dataplus._M_p = (pointer)&(this->ExecutableSuffix).field_2;
  (this->ExecutableSuffix)._M_string_length = 0;
  (this->ExecutableSuffix).field_2._M_local_buf[0] = '\0';
  (this->PkgsDirsVector).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PkgsDirsVector).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PkgsDirsVector).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

cmCPackIFWGenerator::cmCPackIFWGenerator()
{
}